

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          basic_string_view<char,_std::char_traits<char>_> other)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20 = substr(this,pos1,n1);
  iVar1 = compare(&local_20,other);
  return iVar1;
}

Assistant:

nssv_constexpr int compare(size_type pos1, size_type n1, basic_string_view other) const  // (2)
		{
			return substr(pos1, n1).compare(other);
		}